

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pcache1Init(void *NotUsed)

{
  int in_stack_ffffffffffffffec;
  bool local_9;
  
  memset(&pcache1_g,0,0x90);
  local_9 = sqlite3Config.pPage == (void *)0x0 || 0 < sqlite3Config.bCoreMutex;
  pcache1_g.separateCache = (int)local_9;
  if (sqlite3Config.bCoreMutex != 0) {
    pcache1_g.grp.mutex = sqlite3MutexAlloc(in_stack_ffffffffffffffec);
    pcache1_g.mutex = sqlite3MutexAlloc(in_stack_ffffffffffffffec);
  }
  if (((pcache1_g.separateCache == 0) || (sqlite3Config.nPage == 0)) ||
     (sqlite3Config.pPage != (void *)0x0)) {
    pcache1_g.nInitPage = 0;
  }
  else {
    pcache1_g.nInitPage = sqlite3Config.nPage;
  }
  pcache1_g.grp.mxPinned = 10;
  pcache1_g.isInit = 1;
  return 0;
}

Assistant:

static int pcache1Init(void *NotUsed){
  UNUSED_PARAMETER(NotUsed);
  assert( pcache1.isInit==0 );
  memset(&pcache1, 0, sizeof(pcache1));


  /*
  ** The pcache1.separateCache variable is true if each PCache has its own
  ** private PGroup (mode-1).  pcache1.separateCache is false if the single
  ** PGroup in pcache1.grp is used for all page caches (mode-2).
  **
  **   *  Always use a unified cache (mode-2) if ENABLE_MEMORY_MANAGEMENT
  **
  **   *  Use a unified cache in single-threaded applications that have
  **      configured a start-time buffer for use as page-cache memory using
  **      sqlite3_config(SQLITE_CONFIG_PAGECACHE, pBuf, sz, N) with non-NULL 
  **      pBuf argument.
  **
  **   *  Otherwise use separate caches (mode-1)
  */
#if defined(SQLITE_ENABLE_MEMORY_MANAGEMENT)
  pcache1.separateCache = 0;
#elif SQLITE_THREADSAFE
  pcache1.separateCache = sqlite3GlobalConfig.pPage==0
                          || sqlite3GlobalConfig.bCoreMutex>0;
#else
  pcache1.separateCache = sqlite3GlobalConfig.pPage==0;
#endif

#if SQLITE_THREADSAFE
  if( sqlite3GlobalConfig.bCoreMutex ){
    pcache1.grp.mutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_LRU);
    pcache1.mutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_PMEM);
  }
#endif
  if( pcache1.separateCache
   && sqlite3GlobalConfig.nPage!=0
   && sqlite3GlobalConfig.pPage==0
  ){
    pcache1.nInitPage = sqlite3GlobalConfig.nPage;
  }else{
    pcache1.nInitPage = 0;
  }
  pcache1.grp.mxPinned = 10;
  pcache1.isInit = 1;
  return SQLITE_OK;
}